

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

void TestSuite::failHandler(void)

{
  string *psVar1;
  ostream *poVar2;
  
  psVar1 = getInfoMsg_abi_cxx11_();
  if (psVar1->_M_string_length != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"        info: ");
    psVar1 = getInfoMsg_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)psVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  return;
}

Assistant:

static void failHandler() {
        if (!getInfoMsg().empty()) {
            std::cout << "        info: " << getInfoMsg() << std::endl;
        }
    }